

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<Data>::resolve<QtPromisePrivate::PromiseValue<Data>const&>
          (PromiseResolver<Data> *this,PromiseValue<Data> *value)

{
  QPromise<Data> *pQVar1;
  Data *pDVar2;
  PromiseData<Data> *pPVar3;
  QPromise<Data> *promise;
  PromiseValue<Data> *value_local;
  PromiseResolver<Data> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data>::operator->
                     (&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<Data> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<Data>_>::operator->
                       (&(pQVar1->super_QPromiseBase<Data>).m_d);
    PromiseData<Data>::resolve<QtPromisePrivate::PromiseValue<Data>const&>(pPVar3,value);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<Data>_>::operator->
                       (&(pQVar1->super_QPromiseBase<Data>).m_d);
    PromiseDataBase<Data,_void_(const_Data_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<Data,_void_(const_Data_&)>);
    release(this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }